

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_echo_server.cpp
# Opt level: O1

void __thiscall EchoServer::onConnection(EchoServer *this,TcpConnectionPtr *conn)

{
  ulong __n;
  StateE SVar1;
  char *__src;
  int iVar2;
  SourceFile file;
  Logger local_1030;
  string local_60;
  string local_40;
  
  if (sznet::g_logLevel < 1) {
    file._8_8_ = 0x13;
    file.m_data = "tcp_echo_server.cpp";
    sznet::Logger::Logger(&local_1030,file,0x41,TRACE,"onConnection");
    sznet::net::InetAddress::toIpPort_abi_cxx11_
              (&local_40,
               &((conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->m_peerAddr);
    iVar2 = (int)&local_1030 + 0xfb0;
    if (local_40._M_string_length <
        (ulong)(long)(iVar2 - (int)local_1030.m_impl.m_stream.m_buffer.m_cur)) {
      memcpy(local_1030.m_impl.m_stream.m_buffer.m_cur,local_40._M_dataplus._M_p,
             local_40._M_string_length);
      local_1030.m_impl.m_stream.m_buffer.m_cur =
           local_1030.m_impl.m_stream.m_buffer.m_cur + local_40._M_string_length;
    }
    if (4 < (uint)(iVar2 - (int)local_1030.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_1030.m_impl.m_stream.m_buffer.m_cur," -> ",4);
      local_1030.m_impl.m_stream.m_buffer.m_cur = local_1030.m_impl.m_stream.m_buffer.m_cur + 4;
    }
    sznet::net::InetAddress::toIpPort_abi_cxx11_
              (&local_60,
               &((conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->m_localAddr);
    if (local_60._M_string_length <
        (ulong)(long)(iVar2 - (int)local_1030.m_impl.m_stream.m_buffer.m_cur)) {
      memcpy(local_1030.m_impl.m_stream.m_buffer.m_cur,local_60._M_dataplus._M_p,
             local_60._M_string_length);
      local_1030.m_impl.m_stream.m_buffer.m_cur =
           local_1030.m_impl.m_stream.m_buffer.m_cur + local_60._M_string_length;
    }
    if (4 < (uint)(iVar2 - (int)local_1030.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_1030.m_impl.m_stream.m_buffer.m_cur," is ",4);
      local_1030.m_impl.m_stream.m_buffer.m_cur = local_1030.m_impl.m_stream.m_buffer.m_cur + 4;
    }
    SVar1 = ((conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->m_state;
    __n = (ulong)(SVar1 != kConnected) * 2 + 2;
    if (__n < (ulong)(long)(iVar2 - (int)local_1030.m_impl.m_stream.m_buffer.m_cur)) {
      __src = "DOWN";
      if (SVar1 == kConnected) {
        __src = "UP";
      }
      memcpy(local_1030.m_impl.m_stream.m_buffer.m_cur,__src,__n);
      local_1030.m_impl.m_stream.m_buffer.m_cur = local_1030.m_impl.m_stream.m_buffer.m_cur + __n;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    sznet::Logger::~Logger(&local_1030);
  }
  sznet::net::TcpConnection::setTcpNoDelay
            ((conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr,true);
  return;
}

Assistant:

void onConnection(const TcpConnectionPtr& conn)
    {
        LOG_TRACE << conn->peerAddress().toIpPort() << " -> "
            << conn->localAddress().toIpPort() << " is "
            << (conn->connected() ? "UP" : "DOWN");
        conn->setTcpNoDelay(true);
    }